

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

vssListType * __thiscall Instance::getVSS(Instance *this,int ttd)

{
  bool bVar1;
  int iVar2;
  reference ppEVar3;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *pvVar4;
  long in_RSI;
  ast_vector_tpl<z3::expr> *in_RDI;
  size_t i;
  int currNode;
  Edge *currEdge;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> ttdEdges;
  vssType currVss;
  model m;
  vssListType *vss;
  Z3_lbool in_stack_fffffffffffffefc;
  Graph *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *this_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ast_vector_tpl<z3::expr> *this_01;
  undefined1 local_c0 [15];
  undefined1 in_stack_ffffffffffffff4f;
  expr *in_stack_ffffffffffffff50;
  model *in_stack_ffffffffffffff58;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_88;
  int local_7c;
  Edge *local_78;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_60;
  int in_stack_ffffffffffffffc4;
  Graph *in_stack_ffffffffffffffc8;
  
  this_01 = in_RDI;
  z3::optimize::get_model((optimize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1048ce);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1048db);
  Graph::getTTD(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[](&local_60,0);
  local_78 = *ppEVar3;
  bVar1 = Graph::isBoundary(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (bVar1) {
    local_7c = local_78->from;
  }
  else {
    local_7c = local_78->to;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff10,
             (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_88 = (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)0x1;
  while (this_00 = local_88,
        pvVar4 = (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                 std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(&local_60),
        this_00 < pvVar4) {
    in_stack_ffffffffffffff00 = (Graph *)(in_RSI + 0x170);
    local_7c = Edge::getOtherVertex(local_78,local_7c);
    in_stack_ffffffffffffff0c = local_7c;
    z3::ast_vector_tpl<z3::expr>::operator[](this_01,(int)((ulong)in_RDI >> 0x20));
    z3::model::eval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                    (bool)in_stack_ffffffffffffff4f);
    in_stack_fffffffffffffefc = z3::expr::bool_value((expr *)in_stack_ffffffffffffff00);
    z3::expr::~expr((expr *)0x104a33);
    z3::expr::~expr((expr *)0x104a3d);
    if (in_stack_fffffffffffffefc == Z3_L_TRUE) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)this_00,
                  (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      memset(local_c0,0,0x18);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x104a90);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)this_00,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
              );
    ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                        (&local_60,(size_type)local_88);
    local_78 = *ppEVar3;
    local_88 = (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
               ((long)&(local_88->super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  iVar2 = Edge::getOtherVertex(local_78,local_7c);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffefc,iVar2));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             );
  std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  z3::model::~model((model *)in_stack_ffffffffffffff00);
  return (vssListType *)in_RDI;
}

Assistant:

vssListType Instance::getVSS(int ttd) {
  model m = solver.get_model();
  vssListType vss;
  vssType currVss;
  std::vector<const Edge *> ttdEdges = graph.getTTD(ttd);
  const Edge *currEdge = ttdEdges[0];
  int currNode =
      graph.isBoundary(currEdge->from) ? currEdge->from : currEdge->to;
  currVss.push_back(currNode);
  for (size_t i = 1; i < ttdEdges.size(); i++) {
    if (m.eval(borderVars[(currNode = currEdge->getOtherVertex(currNode))],
               false)
            .bool_value() == Z3_TRUE) {
      currVss.push_back(currNode);
      vss.push_back(currVss);
      currVss = vssType();
    }
    currVss.push_back(currNode);
    currEdge = ttdEdges[i];
  }
  currVss.push_back(currEdge->getOtherVertex(currNode));
  vss.push_back(currVss);
  return vss;
}